

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlParseJson.c
# Opt level: O1

JL_STATUS SkipWhiteSpace(ParseParameters *Params,char *pNextChar)

{
  char cVar1;
  char cVar2;
  _Bool _Var3;
  ulong uVar4;
  char *pcVar5;
  bool bVar6;
  byte bVar7;
  bool bVar8;
  JL_STATUS JVar9;
  char cVar10;
  long lVar11;
  byte bVar12;
  
  JVar9 = JL_STATUS_END_OF_DATA;
  bVar6 = false;
  bVar7 = 0;
  do {
    uVar4 = Params->StringIndex;
    if (Params->JsonStringLength <= uVar4) {
      return JVar9;
    }
    pcVar5 = Params->JsonString;
    cVar1 = pcVar5[uVar4 + 1];
    if (cVar1 == '\0') {
      cVar10 = '\0';
    }
    else {
      cVar10 = pcVar5[uVar4 + 2];
    }
    cVar2 = pcVar5[uVar4];
    if ((bool)(bVar7 & cVar2 == '\n')) {
      bVar7 = 0;
      goto switchD_0011c613_caseD_9;
    }
    lVar11 = 1;
    if (((bVar6) && (cVar2 == '*')) && (cVar1 == '/')) {
      bVar6 = false;
      goto LAB_0011c5e2;
    }
    if ((bool)(bVar6 | bVar7)) goto switchD_0011c613_caseD_9;
    switch(cVar2) {
    case '\t':
    case '\n':
    case '\r':
      break;
    case '\v':
      if (Params->IsJson5 == false) {
        if (cVar2 != '\f') goto LAB_0011c627;
        goto switchD_0011c613_caseD_c;
      }
      break;
    case '\f':
switchD_0011c613_caseD_c:
      if (Params->IsJson5 != false) break;
LAB_0011c627:
      _Var3 = Params->IsJson5;
      if ((cVar1 == -0x60 & cVar2 == -0x3e & _Var3) != 0) {
LAB_0011c5e2:
        Params->StringIndex = uVar4 + lVar11;
        break;
      }
      if (((_Var3 != false) && (cVar2 == -0x11)) && ((cVar1 == -0x45 && (cVar10 == -0x41)))) {
        lVar11 = 2;
        goto LAB_0011c5e2;
      }
      bVar12 = _Var3 & cVar2 == '/';
      if ((cVar1 == '/' & bVar12) != 0) {
        bVar7 = 1;
        goto LAB_0011c5e2;
      }
      if ((cVar1 == '*' & bVar12) != 0) {
        bVar6 = true;
        goto LAB_0011c5e2;
      }
      *pNextChar = cVar2;
      JVar9 = JL_STATUS_SUCCESS;
      bVar8 = false;
      goto LAB_0011c689;
    default:
      if (cVar2 != ' ') goto LAB_0011c627;
    }
switchD_0011c613_caseD_9:
    Params->StringIndex = Params->StringIndex + 1;
    bVar8 = true;
LAB_0011c689:
    if (!bVar8) {
      return JVar9;
    }
  } while( true );
}

Assistant:

static
JL_STATUS
    SkipWhiteSpace
    (
        ParseParameters*    Params,
        char*               pNextChar
    )
{
    JL_STATUS jlStatus;
    bool inSingleLineComment = false;
    bool inMultiLineComment = false;

    jlStatus = JL_STATUS_END_OF_DATA;
    while( Params->StringIndex < Params->JsonStringLength )
    {
        char currentChar = Params->JsonString[Params->StringIndex];
        char nextChar = Params->JsonString[Params->StringIndex+1];
        char nextNextChar = 0 != nextChar ? Params->JsonString[Params->StringIndex+2] : 0;

        // See if currently in a comment and if this is the end of comment.
        if( inSingleLineComment && '\n' == currentChar )
        {
            inSingleLineComment = false;
        }
        else if( inMultiLineComment && '*' == currentChar && '/' == nextChar )
        {
            inMultiLineComment = false;
            Params->StringIndex  += 1;      // Skip the extra char (the '/')
        }
        else if( inSingleLineComment || inMultiLineComment )
        {
            // In comment, so ignore
        }
        else if(     ' '  == currentChar
            ||  '\n' == currentChar
            ||  '\r' == currentChar
            ||  '\t' == currentChar
            ||  ( '\v' == currentChar && Params->IsJson5 )
            ||  ( '\f' == currentChar && Params->IsJson5 ) )
        {
            // White space, so ignore
        }
        else if( Params->IsJson5 && '\xc2' == currentChar && '\xa0' == nextChar )
        {
            // Non-breaking space allowed by json5
            Params->StringIndex += 1;
        }
        else if(    Params->IsJson5
                 && (   ( '\xe2' == currentChar && '\x80' == nextChar && '\xa8' == nextNextChar )        // Line separator
                     || ( '\xe2' == currentChar && '\x80' == nextChar && '\xa9' == nextNextChar )        // Paragraph separator
                     || ( '\xef' == currentChar && '\xbb' == nextChar && '\xbf' == nextNextChar ) ) )    // Byte order mark
        {
            // Extra white space allowed by json5
            Params->StringIndex += 2;
        }
        else if( Params->IsJson5 && '/' == currentChar && '/' == nextChar )
        {
            inSingleLineComment = true;
            Params->StringIndex += 1;
        }
        else if( Params->IsJson5 && '/' == currentChar && '*' == nextChar )
        {
            inMultiLineComment = true;
            Params->StringIndex += 1;
        }
        else
        {
            // First non whitespace/comment
            *pNextChar = currentChar;
            jlStatus = JL_STATUS_SUCCESS;
            break;
        }

        Params->StringIndex += 1;
    }

    return jlStatus;
}